

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_ScriptRunning(FParser *this)

{
  int iVar1;
  DFraggleThinker *pDVar2;
  DRunningScript *pDVar3;
  DFsScript *pDVar4;
  DRunningScript *pDStack_18;
  int snum;
  DRunningScript *current;
  FParser *this_local;
  
  if (this->t_argc < 1) {
    script_error("not enough arguments to function\n");
  }
  else {
    iVar1 = intvalue(this->t_argv);
    pDVar2 = TObjPtr<DFraggleThinker>::operator->(&DFraggleThinker::ActiveThinker);
    pDVar3 = TObjPtr<DRunningScript>::operator->(&pDVar2->RunningScripts);
    for (pDStack_18 = ::TObjPtr::operator_cast_to_DRunningScript_((TObjPtr *)&pDVar3->next);
        pDStack_18 != (DRunningScript *)0x0;
        pDStack_18 = ::TObjPtr::operator_cast_to_DRunningScript_((TObjPtr *)&pDStack_18->next)) {
      pDVar4 = TObjPtr<DFsScript>::operator->(&pDStack_18->script);
      if (pDVar4->scriptnum == iVar1) {
        (this->t_return).type = 1;
        (this->t_return).value.i = 1;
        return;
      }
    }
    (this->t_return).type = 1;
    (this->t_return).value.i = 0;
  }
  return;
}

Assistant:

void FParser::SF_ScriptRunning()
{
	DRunningScript *current;
	int snum = 0;
	
	if(t_argc < 1)
	{
		script_error("not enough arguments to function\n");
		return;
	}
	
	snum = intvalue(t_argv[0]);  
	
	for(current = DFraggleThinker::ActiveThinker->RunningScripts->next; current; current=current->next)
	{
		if(current->script->scriptnum == snum)
		{
			// script found so return
			t_return.type = svt_int;
			t_return.value.i = 1;
			return;
		}
	}
	
	// script not found
	t_return.type = svt_int;
	t_return.value.i = 0;
}